

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_event.cpp
# Opt level: O2

void eco_event::efd_unset_ioevent(int efd,int fd)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_co_io_slot_*>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  int *piVar1;
  mapped_type __x;
  long *plVar2;
  size_type sVar3;
  mapped_type *ppcVar4;
  key_type local_34;
  key_type local_30;
  int local_2c;
  
  plVar2 = (long *)__tls_get_addr(&PTR_00144f68);
  piVar1 = *(int **)(*(long *)(*plVar2 + 0x48) + 0x50);
  this = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_co_io_slot_*>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)(piVar1 + 0x18);
  local_34 = fd;
  sVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_co_io_slot_*>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(this,&local_34);
  if (sVar3 != 0) {
    local_30 = fd;
    ppcVar4 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_co_io_slot_*>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_co_io_slot_*>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,&local_30);
    __x = *ppcVar4;
    if (__x->recv_co != (aco_t *)0x0) {
      std::deque<aco_s_*,_std::allocator<aco_s_*>_>::push_back
                ((deque<aco_s_*,_std::allocator<aco_s_*>_> *)(piVar1 + 4),&__x->recv_co);
    }
    if (__x->send_co != (value_type)0x0) {
      std::deque<aco_s_*,_std::allocator<aco_s_*>_>::push_back
                ((deque<aco_s_*,_std::allocator<aco_s_*>_> *)(piVar1 + 4),&__x->send_co);
    }
    local_2c = fd;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_co_io_slot_*>,_std::allocator<std::pair<const_unsigned_int,_co_io_slot_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(this);
    operator_delete(__x);
    epoll_ctl(*piVar1,2,fd,(epoll_event *)0x0);
  }
  return;
}

Assistant:

void eco_event::efd_unset_ioevent(int efd, int fd)
{
  co_loop_t* g = (co_loop_t*)(aco_get_co()->main_co->arg);
  if (g->io_map.count(fd) > 0)
  {
    co_io_slot_t *io = g->io_map[fd];

    /* 如果是读事件就唤醒读 */
    if (io->recv_co)
      g->g_queue.push(io->recv_co);

    /* 如果是写事件就唤醒写 */
    if (io->send_co)
      g->g_queue.push(io->send_co);

    // 清除对象
    g->io_map.erase(fd);
    /* 清除内存 */
    delete io;

#if defined(ECO_EPOLL)
  epoll_ctl(g->efd, EPOLL_CTL_DEL, fd, nullptr);
#elif defined(ECO_KQUEUE)
  struct kevent event;
  EV_SET(&event, fd, EVFILT_WRITE, EV_DELETE, 0, 0, nullptr);
  kevent(efd, &event, 1, nullptr, 0, nullptr);
  EV_SET(&event, fd, EVFILT_READ, EV_DELETE, 0, 0, nullptr);
  kevent(efd, &event, 1, nullptr, 0, nullptr);
#endif

  }
}